

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

void __thiscall CoreML::ShapeConstraint::updateConstraint(ShapeConstraint *this,FeatureType *type)

{
  bool bVar1;
  TypeCase TVar2;
  ImageFeatureType_ColorSpace IVar3;
  SizeFlexibilityCase SVar4;
  int iVar5;
  ShapeFlexibilityCase SVar6;
  int iVar7;
  ImageFeatureType *pIVar8;
  ImageFeatureType_EnumeratedImageSizes *pIVar9;
  ImageFeatureType_ImageSize *pIVar10;
  uint64 uVar11;
  ImageFeatureType_ImageSizeRange *pIVar12;
  SizeRange *pSVar13;
  size_t sVar14;
  ArrayFeatureType *pAVar15;
  ArrayFeatureType_EnumeratedShapes *pAVar16;
  RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape> *this_00;
  ArrayFeatureType_Shape *this_01;
  ArrayFeatureType_ShapeRange *pAVar17;
  size_type sVar18;
  reference pvVar19;
  runtime_error *prVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  ShapeRange local_188;
  int local_164;
  undefined1 local_160 [4];
  int i_2;
  ulong local_140;
  size_t size;
  ulong uStack_130;
  int i_1;
  size_t maxSize;
  size_t minSize;
  reference pAStack_118;
  int d;
  ArrayFeatureType_Shape *shape;
  const_iterator __end4;
  const_iterator __begin4;
  RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape> *__range4;
  int maxDims;
  undefined1 local_e8 [8];
  vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> ranges;
  ShapeRange allowedHeights;
  ShapeRange allowedWidths;
  ShapeRange heightRange;
  ShapeRange widthRange;
  size_t height;
  size_t width;
  ulong uStack_38;
  int i;
  size_t max_height;
  size_t min_height;
  size_t max_width;
  size_t min_width;
  FeatureType *type_local;
  ShapeConstraint *this_local;
  
  TVar2 = Specification::FeatureType::Type_case(type);
  if (TVar2 == kImageType) {
    pIVar8 = Specification::FeatureType::imagetype(type);
    IVar3 = Specification::ImageFeatureType::colorspace(pIVar8);
    if (IVar3 == ImageFeatureType_ColorSpace_GRAYSCALE) {
      setChannel(this,1);
    }
    else {
      setChannel(this,3);
    }
    pIVar8 = Specification::FeatureType::imagetype(type);
    SVar4 = Specification::ImageFeatureType::SizeFlexibility_case(pIVar8);
    if (SVar4 == SIZEFLEXIBILITY_NOT_SET) {
      pIVar8 = Specification::FeatureType::imagetype(type);
      sVar14 = Specification::ImageFeatureType::height(pIVar8);
      setHeight(this,sVar14);
      pIVar8 = Specification::FeatureType::imagetype(type);
      sVar14 = Specification::ImageFeatureType::width(pIVar8);
      setWidth(this,sVar14);
    }
    else if (SVar4 == kEnumeratedSizes) {
      max_width = 0xffffffffffffffff;
      min_height = 0;
      max_height = 0xffffffffffffffff;
      uStack_38 = 0;
      width._4_4_ = 0;
      while( true ) {
        pIVar8 = Specification::FeatureType::imagetype(type);
        pIVar9 = Specification::ImageFeatureType::enumeratedsizes(pIVar8);
        iVar5 = Specification::ImageFeatureType_EnumeratedImageSizes::sizes_size(pIVar9);
        if (iVar5 <= width._4_4_) break;
        pIVar8 = Specification::FeatureType::imagetype(type);
        pIVar9 = Specification::ImageFeatureType::enumeratedsizes(pIVar8);
        pIVar10 = Specification::ImageFeatureType_EnumeratedImageSizes::sizes(pIVar9,width._4_4_);
        uVar11 = Specification::ImageFeatureType_ImageSize::width(pIVar10);
        if (min_height < uVar11) {
          min_height = uVar11;
        }
        if (uVar11 < max_width) {
          max_width = uVar11;
        }
        pIVar8 = Specification::FeatureType::imagetype(type);
        pIVar9 = Specification::ImageFeatureType::enumeratedsizes(pIVar8);
        pIVar10 = Specification::ImageFeatureType_EnumeratedImageSizes::sizes(pIVar9,width._4_4_);
        uVar11 = Specification::ImageFeatureType_ImageSize::height(pIVar10);
        if (uStack_38 < uVar11) {
          uStack_38 = uVar11;
        }
        if (uVar11 < max_height) {
          max_height = uVar11;
        }
        width._4_4_ = width._4_4_ + 1;
      }
      ShapeRange::ShapeRange((ShapeRange *)&heightRange._maximum._val,max_width,min_height);
      updateWidthRange(this,(ShapeRange *)&heightRange._maximum._val);
      ShapeRange::ShapeRange((ShapeRange *)&allowedWidths._maximum._val,max_height,uStack_38);
      updateHeightRange(this,(ShapeRange *)&allowedWidths._maximum._val);
    }
    else if (SVar4 == kImageSizeRange) {
      pIVar8 = Specification::FeatureType::imagetype(type);
      pIVar12 = Specification::ImageFeatureType::imagesizerange(pIVar8);
      pSVar13 = Specification::ImageFeatureType_ImageSizeRange::widthrange(pIVar12);
      ShapeRange::ShapeRange((ShapeRange *)&allowedHeights._maximum._val,pSVar13);
      updateWidthRange(this,(ShapeRange *)&allowedHeights._maximum._val);
      pIVar8 = Specification::FeatureType::imagetype(type);
      pIVar12 = Specification::ImageFeatureType::imagesizerange(pIVar8);
      pSVar13 = Specification::ImageFeatureType_ImageSizeRange::heightrange(pIVar12);
      ShapeRange::ShapeRange
                ((ShapeRange *)
                 &ranges.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pSVar13);
      updateHeightRange(this,(ShapeRange *)
                             &ranges.
                              super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  else {
    TVar2 = Specification::FeatureType::Type_case(type);
    if (TVar2 != kMultiArrayType) {
      prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_210,"Attempting to update feature constraint ",&this->_name);
      std::operator+(&local_1f0,&local_210,
                     " with a type description which is not a multi array or image.");
      std::runtime_error::runtime_error(prVar20,(string *)&local_1f0);
      __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::vector
              ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_e8);
    pAVar15 = Specification::FeatureType::multiarraytype(type);
    SVar6 = Specification::ArrayFeatureType::ShapeFlexibility_case(pAVar15);
    if (SVar6 != SHAPEFLEXIBILITY_NOT_SET) {
      if (SVar6 == kEnumeratedShapes) {
        __range4._0_4_ = 0;
        pAVar15 = Specification::FeatureType::multiarraytype(type);
        pAVar16 = Specification::ArrayFeatureType::enumeratedshapes(pAVar15);
        this_00 = Specification::ArrayFeatureType_EnumeratedShapes::shapes(pAVar16);
        __end4 = google::protobuf::RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::
                 begin(this_00);
        shape = (ArrayFeatureType_Shape *)
                google::protobuf::RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::
                end(this_00);
        while (bVar1 = google::protobuf::internal::
                       RepeatedPtrIterator<const_CoreML::Specification::ArrayFeatureType_Shape>::
                       operator!=(&__end4,(iterator *)&shape), bVar1) {
          pAStack_118 = google::protobuf::internal::
                        RepeatedPtrIterator<const_CoreML::Specification::ArrayFeatureType_Shape>::
                        operator*(&__end4);
          iVar5 = Specification::ArrayFeatureType_Shape::shape_size(pAStack_118);
          if ((int)__range4 < iVar5) {
            __range4._0_4_ = Specification::ArrayFeatureType_Shape::shape_size(pAStack_118);
          }
          google::protobuf::internal::
          RepeatedPtrIterator<const_CoreML::Specification::ArrayFeatureType_Shape>::operator++
                    (&__end4);
        }
        for (minSize._4_4_ = 0; minSize._4_4_ < (int)__range4; minSize._4_4_ = minSize._4_4_ + 1) {
          maxSize = 0xffffffffffffffff;
          uStack_130 = 0;
          size._4_4_ = 0;
          while( true ) {
            iVar5 = size._4_4_;
            pAVar15 = Specification::FeatureType::multiarraytype(type);
            pAVar16 = Specification::ArrayFeatureType::enumeratedshapes(pAVar15);
            iVar7 = Specification::ArrayFeatureType_EnumeratedShapes::shapes_size(pAVar16);
            if (iVar7 <= iVar5) break;
            pAVar15 = Specification::FeatureType::multiarraytype(type);
            pAVar16 = Specification::ArrayFeatureType::enumeratedshapes(pAVar15);
            this_01 = Specification::ArrayFeatureType_EnumeratedShapes::shapes(pAVar16,size._4_4_);
            local_140 = Specification::ArrayFeatureType_Shape::shape(this_01,minSize._4_4_);
            if (local_140 < maxSize) {
              maxSize = local_140;
            }
            if (uStack_130 < local_140) {
              uStack_130 = local_140;
            }
            size._4_4_ = size._4_4_ + 1;
          }
          ShapeRange::ShapeRange((ShapeRange *)local_160,maxSize,uStack_130);
          std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::push_back
                    ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_e8,
                     (value_type *)local_160);
        }
      }
      else if (SVar6 == kShapeRange) {
        local_164 = 0;
        while( true ) {
          iVar5 = local_164;
          pAVar15 = Specification::FeatureType::multiarraytype(type);
          pAVar17 = Specification::ArrayFeatureType::shaperange(pAVar15);
          iVar7 = Specification::ArrayFeatureType_ShapeRange::sizeranges_size(pAVar17);
          if (iVar7 <= iVar5) break;
          pAVar15 = Specification::FeatureType::multiarraytype(type);
          pAVar17 = Specification::ArrayFeatureType::shaperange(pAVar15);
          pSVar13 = Specification::ArrayFeatureType_ShapeRange::sizeranges(pAVar17,local_164);
          ShapeRange::ShapeRange(&local_188,pSVar13);
          std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::push_back
                    ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_e8,
                     &local_188);
          local_164 = local_164 + 1;
        }
      }
    }
    sVar18 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::size
                       ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_e8)
    ;
    if (sVar18 == 1) {
      pvVar19 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::operator[]
                          ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)
                           local_e8,0);
      updateChannelRange(this,pvVar19);
    }
    else {
      sVar18 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::size
                         ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)
                          local_e8);
      if (sVar18 == 3) {
        pvVar19 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::operator[]
                            ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)
                             local_e8,0);
        updateChannelRange(this,pvVar19);
        pvVar19 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::operator[]
                            ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)
                             local_e8,1);
        updateHeightRange(this,pvVar19);
        pvVar19 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::operator[]
                            ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)
                             local_e8,2);
        updateWidthRange(this,pvVar19);
      }
      else {
        sVar18 = std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::size
                           ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)
                            local_e8);
        if (sVar18 != 0) {
          local_1c9 = 1;
          prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_1c8,"Attempting to constrain an input or output feature \"",
                         &this->_name);
          std::operator+(&local_1a8,&local_1c8,"\" with an invalid array shape constraint.");
          std::runtime_error::runtime_error(prVar20,(string *)&local_1a8);
          local_1c9 = 0;
          __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pAVar15 = Specification::FeatureType::multiarraytype(type);
        sVar14 = Specification::ArrayFeatureType::shape(pAVar15,0);
        setChannel(this,sVar14);
        pAVar15 = Specification::FeatureType::multiarraytype(type);
        iVar5 = Specification::ArrayFeatureType::shape_size(pAVar15);
        if (iVar5 == 3) {
          pAVar15 = Specification::FeatureType::multiarraytype(type);
          sVar14 = Specification::ArrayFeatureType::shape(pAVar15,1);
          setHeight(this,sVar14);
          pAVar15 = Specification::FeatureType::multiarraytype(type);
          sVar14 = Specification::ArrayFeatureType::shape(pAVar15,2);
          setWidth(this,sVar14);
        }
        else {
          setHeight(this,1);
          setWidth(this,1);
        }
      }
    }
    std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::~vector
              ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_e8);
  }
  return;
}

Assistant:

void ShapeConstraint::updateConstraint(const Specification::FeatureType& type) {

    if (type.Type_case() == Specification::FeatureType::kImageType) {

        // Handle the number of channels first
        if (type.imagetype().colorspace() == Specification::ImageFeatureType_ColorSpace_GRAYSCALE)
            setChannel(1);
        else {
            setChannel(3);
        }

        switch (type.imagetype().SizeFlexibility_case()) {

            case CoreML::Specification::ImageFeatureType::kEnumeratedSizes: {

                size_t min_width = SIZE_MAX;
                size_t max_width = 0;
                size_t min_height = SIZE_MAX;
                size_t max_height = 0;
                for (int i = 0; i < type.imagetype().enumeratedsizes().sizes_size(); i++) {
                    size_t width = (size_t)type.imagetype().enumeratedsizes().sizes(i).width();
                    if (width > max_width)
                        max_width = width;
                    if (width < min_width)
                        min_width = width;

                    size_t height = (size_t)type.imagetype().enumeratedsizes().sizes(i).height();
                    if (height > max_height)
                        max_height = height;
                    if (height < min_height)
                        min_height = height;
                }

                // This is a hack, in that it loses the numerated nature of the constraint
                ShapeRange widthRange = ShapeRange(min_width, max_width);
                updateWidthRange(widthRange);

                ShapeRange heightRange = ShapeRange(min_height, max_height);
                updateHeightRange(heightRange);

                break;
            }
            case CoreML::Specification::ImageFeatureType::kImageSizeRange: {

                ShapeRange allowedWidths(type.imagetype().imagesizerange().widthrange());
                updateWidthRange(allowedWidths);

                ShapeRange allowedHeights(type.imagetype().imagesizerange().heightrange());
                updateHeightRange(allowedHeights);

                break;
            }
            case CoreML::Specification::ImageFeatureType::SIZEFLEXIBILITY_NOT_SET: {
                // the back compatible portion -- if the shape isn't set, then we'll use the old fields
                setHeight(static_cast<size_t>(type.imagetype().height()));
                setWidth(static_cast<size_t>(type.imagetype().width()));

                break;
            }

        } // switch

    } // is an image
    else if (type.Type_case() == Specification::FeatureType::kMultiArrayType) {

        std::vector<ShapeRange> ranges;

        switch (type.multiarraytype().ShapeFlexibility_case()) {

            case CoreML::Specification::ArrayFeatureType::kEnumeratedShapes: {
                int maxDims = 0;
                for (const auto &shape : type.multiarraytype().enumeratedshapes().shapes()) {
                    if (shape.shape_size() > maxDims) {
                        maxDims = shape.shape_size();
                    }
                }
                for (int d=0; d<maxDims; d++) {
                    size_t minSize = SIZE_MAX;
                    size_t maxSize = 0;
                    for (int i = 0; i < type.multiarraytype().enumeratedshapes().shapes_size(); i++) {
                        size_t size = static_cast<size_t>(type.multiarraytype().enumeratedshapes().shapes(i).shape(d));
                        if (minSize > size)
                            minSize = size;
                        if (maxSize < size)
                            maxSize = size;
                    }
                    ranges.push_back(ShapeRange(minSize,maxSize));
                }
                break;
            }
            case CoreML::Specification::ArrayFeatureType::kShapeRange: {
                for (int i = 0; i < type.multiarraytype().shaperange().sizeranges_size(); i++) {
                    ranges.push_back(ShapeRange(type.multiarraytype().shaperange().sizeranges(i)));
                }
                break;
            }
            case  CoreML::Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                break;
        }

        if (ranges.size() == 1) {
            updateChannelRange(ranges[0]);
        }
        else if (ranges.size() == 3) {
            updateChannelRange(ranges[0]);
            updateHeightRange(ranges[1]);
            updateWidthRange(ranges[2]);
        }
        else if (ranges.size() == 0) {
            // legacy case for older models.
            setChannel(static_cast<size_t>(type.multiarraytype().shape(0)));
            if (type.multiarraytype().shape_size() == 3) {
                setHeight(static_cast<size_t>(type.multiarraytype().shape(1)));
                setWidth(static_cast<size_t>(type.multiarraytype().shape(2)));
            }
            else {
                setHeight(1);
                setWidth(1);
            }
        }
        else {
            throw std::runtime_error("Attempting to constrain an input or output feature \"" + _name + "\" with an invalid array shape constraint.");
        }

    }
    else {
        throw std::runtime_error("Attempting to update feature constraint " + _name + " with a type description which is not a multi array or image.");
    }

}